

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.hpp
# Opt level: O2

bool __thiscall bloom_filter::contains(bloom_filter *this,uchar *key_begin,size_t length)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong local_48;
  size_t bit_index;
  size_t bit;
  
  local_48 = 0;
  bit_index = 0;
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    puVar1 = (this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(this->salt_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
    if (uVar4 <= uVar3) break;
    bit._4_4_ = hash_ap(this,key_begin,length,puVar1[uVar3]);
    (*this->_vptr_bloom_filter[4])(this,(long)&bit + 4,&local_48,&bit_index);
    uVar2 = uVar3 + 1;
  } while ((bit_mask[bit_index] &
           ~(this->bit_table_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[local_48 >> 3]) == 0);
  return uVar4 <= uVar3;
}

Assistant:

inline virtual bool contains(const unsigned char* key_begin, const std::size_t length) const
   {
      std::size_t bit_index = 0;
      std::size_t bit       = 0;

      for (std::size_t i = 0; i < salt_.size(); ++i)
      {
         compute_indices(hash_ap(key_begin, length, salt_[i]), bit_index, bit);

         if ((bit_table_[bit_index / bits_per_char] & bit_mask[bit]) != bit_mask[bit])
         {
            return false;
         }
      }

      return true;
   }